

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_locate_warm(REF_INTERP ref_interp)

{
  REF_MPI ref_mpi;
  REF_NODE pRVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  REF_STATUS RVar5;
  ulong unaff_R14;
  bool bVar6;
  REF_BOOL increase_fuzz;
  REF_BOOL local_3c;
  REF_MPI local_38;
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar1 = ref_interp->to_grid->node;
  if (ref_interp->instrument != 0) {
    uVar2 = ref_mpi_stopwatch_start(ref_mpi);
    unaff_R14 = (ulong)uVar2;
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x6de,"ref_interp_locate_warm",unaff_R14,"locate clock");
      return uVar2;
    }
  }
  local_38 = ref_mpi;
  if (0 < pRVar1->max) {
    lVar4 = 0;
    do {
      if (((-1 < pRVar1->global[lVar4]) && (pRVar1->ref_mpi->id == pRVar1->part[lVar4])) &&
         (ref_interp->cell[lVar4] != -1)) {
        uVar2 = ref_interp_push_onto_queue(ref_interp,(REF_INT)lVar4);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x6e2,"ref_interp_locate_warm",(ulong)uVar2,"queue neighbors");
          unaff_R14 = (ulong)uVar2;
        }
        if (uVar2 != 0) {
          return (REF_STATUS)unaff_R14;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pRVar1->max);
  }
  uVar2 = ref_interp_process_agents(ref_interp);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x6e6,
           "ref_interp_locate_warm",(ulong)uVar2,"drain");
    unaff_R14 = (ulong)uVar2;
  }
  RVar5 = (REF_STATUS)unaff_R14;
  if (uVar2 == 0) {
    if (ref_interp->instrument != 0) {
      uVar2 = ref_mpi_stopwatch_stop(local_38,"drain");
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x6e8,"ref_interp_locate_warm",(ulong)uVar2,"locate clock");
        unaff_R14 = (ulong)uVar2;
      }
      if (uVar2 != 0) {
        return (REF_STATUS)unaff_R14;
      }
    }
    local_3c = 0;
    iVar3 = 0xb;
    do {
      if ((local_3c != 0) &&
         (ref_interp->search_fuzz = ref_interp->search_fuzz * 10.0, local_38->id == 0)) {
        printf("retry tree search with %e fuzz\n");
      }
      uVar2 = ref_interp_tree(ref_interp,&local_3c);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x6f2,"ref_interp_locate_warm",(ulong)uVar2,"tree");
        unaff_R14 = (ulong)uVar2;
      }
      if (uVar2 != 0) {
        return (REF_STATUS)unaff_R14;
      }
      if (ref_interp->instrument != 0) {
        uVar2 = ref_mpi_stopwatch_stop(local_38,"tree");
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x6f4,"ref_interp_locate_warm",(ulong)uVar2,"locate clock");
          unaff_R14 = (ulong)uVar2;
        }
        if (uVar2 != 0) {
          return (REF_STATUS)unaff_R14;
        }
      }
      bVar6 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while ((local_3c != 0) && (bVar6));
    if ((long)local_3c == 0) {
      RVar5 = 0;
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x6f7,"ref_interp_locate_warm","unable to grow fuzz to find tree candidate",0,
             (long)local_3c);
      RVar5 = 1;
    }
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_warm(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  REF_BOOL increase_fuzz;
  REF_INT tries;
  REF_INT node;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      RSS(ref_interp_push_onto_queue(ref_interp, node), "queue neighbors");
    }
  }

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  return REF_SUCCESS;
}